

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

Vec_Int_t * Exp_And(int *pMan,int nVars,Vec_Int_t *p0,Vec_Int_t *p1,int fCompl0,int fCompl1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *p;
  Vec_Int_t *r;
  int Len1;
  int Len0;
  int i;
  int fCompl1_local;
  int fCompl0_local;
  Vec_Int_t *p1_local;
  Vec_Int_t *p0_local;
  int nVars_local;
  int *pMan_local;
  
  uVar1 = Vec_IntSize(p0);
  uVar2 = Vec_IntSize(p1);
  p = Vec_IntAlloc(uVar1 + uVar2 + 1);
  if (((uVar1 & 1) == 0) || ((uVar2 & 1) == 0)) {
    __assert_fail("(Len0 & 1) && (Len1 & 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/exp.h"
                  ,0x8b,"Vec_Int_t *Exp_And(int *, int, Vec_Int_t *, Vec_Int_t *, int, int)");
  }
  Vec_IntPush(p,(nVars + (int)uVar1 / 2 + (int)uVar2 / 2) * 2);
  uVar3 = Vec_IntEntry(p0,0);
  iVar4 = Exp_LitShift(nVars,uVar3 ^ fCompl0,(int)uVar2 / 2);
  Vec_IntPush(p,iVar4);
  uVar3 = Vec_IntEntry(p1,0);
  Vec_IntPush(p,uVar3 ^ fCompl1);
  for (Len1 = 1; Len1 < (int)uVar1; Len1 = Len1 + 1) {
    iVar4 = Vec_IntEntry(p0,Len1);
    iVar4 = Exp_LitShift(nVars,iVar4,(int)uVar2 / 2);
    Vec_IntPush(p,iVar4);
  }
  for (Len1 = 1; Len1 < (int)uVar2; Len1 = Len1 + 1) {
    iVar4 = Vec_IntEntry(p1,Len1);
    Vec_IntPush(p,iVar4);
  }
  iVar4 = Vec_IntSize(p);
  if (iVar4 == uVar1 + uVar2 + 1) {
    return p;
  }
  __assert_fail("Vec_IntSize(r) == Len0 + Len1 + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/exp.h"
                ,0x93,"Vec_Int_t *Exp_And(int *, int, Vec_Int_t *, Vec_Int_t *, int, int)");
}

Assistant:

static inline Vec_Int_t * Exp_And( int * pMan, int nVars, Vec_Int_t * p0, Vec_Int_t * p1, int fCompl0, int fCompl1 )
{
    int i, Len0 = Vec_IntSize(p0), Len1 = Vec_IntSize(p1);
    Vec_Int_t * r = Vec_IntAlloc( Len0 + Len1 + 1 );
    assert( (Len0 & 1) && (Len1 & 1) );
    Vec_IntPush( r, 2 * (nVars + Len0/2 + Len1/2) );
    Vec_IntPush( r, Exp_LitShift( nVars, Vec_IntEntry(p0, 0) ^ fCompl0, Len1/2 ) );
    Vec_IntPush( r, Vec_IntEntry(p1, 0) ^ fCompl1 );
    for ( i = 1; i < Len0; i++ )
        Vec_IntPush( r, Exp_LitShift( nVars, Vec_IntEntry(p0, i), Len1/2 ) );
    for ( i = 1; i < Len1; i++ )
        Vec_IntPush( r, Vec_IntEntry(p1, i) );
    assert( Vec_IntSize(r) == Len0 + Len1 + 1 );
    return r;
}